

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall cmGeneratorTarget::ImportedGetLocation(cmGeneratorTarget *this,string *config)

{
  int iVar1;
  string local_30;
  
  if (ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&ImportedGetLocation(std::__cxx11::string_const&)::
                                 location_abi_cxx11_);
    if (iVar1 != 0) {
      ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_._M_dataplus._M_p =
           (pointer)&ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_.field_2;
      ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_._M_string_length = 0;
      ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_.field_2._M_local_buf[0]
           = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_);
    }
  }
  if (this->Target->IsImportedTarget != false) {
    cmTarget::ImportedGetFullPath(&local_30,this->Target,config,false);
    std::__cxx11::string::operator=
              ((string *)&ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,
               (string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_._M_dataplus._M_p;
  }
  __assert_fail("this->IsImported()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0xd90,
                "const char *cmGeneratorTarget::ImportedGetLocation(const std::string &) const");
}

Assistant:

const char*
cmGeneratorTarget::ImportedGetLocation(const std::string& config) const
{
  static std::string location;
  assert(this->IsImported());
  location = this->Target->ImportedGetFullPath(config, false);
  return location.c_str();
}